

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O0

Position __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::Skip(CordRepBtreeNavigator *this,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  Position PVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  CordRepBtreeNavigator *local_48;
  CordRep *edge;
  CordRepBtree *node;
  size_t index;
  size_t sStack_28;
  int height;
  size_t n_local;
  CordRepBtreeNavigator *this_local;
  size_t local_10;
  
  index._4_4_ = 0;
  node = (CordRepBtree *)(ulong)this->index_[0];
  edge = &this->node_[0]->super_CordRep;
  local_48 = (CordRepBtreeNavigator *)CordRepBtree::Edge((CordRepBtree *)edge,(size_t)node);
  sStack_28 = n;
  do {
    uVar1._0_4_ = local_48->height_;
    uVar1._4_1_ = local_48->index_[0];
    uVar1._5_1_ = local_48->index_[1];
    uVar1._6_1_ = local_48->index_[2];
    uVar1._7_1_ = local_48->index_[3];
    if (sStack_28 < uVar1) {
      while (0 < index._4_4_) {
        pCVar4 = CordRep::btree((CordRep *)local_48);
        this->index_[index._4_4_] = (uint8_t)node;
        index._4_4_ = index._4_4_ + -1;
        this->node_[index._4_4_] = pCVar4;
        node = (CordRepBtree *)CordRepBtree::begin(pCVar4);
        local_48 = (CordRepBtreeNavigator *)CordRepBtree::Edge(pCVar4,(size_t)node);
        while (uVar2._0_4_ = local_48->height_, uVar2._4_1_ = local_48->index_[0],
              uVar2._5_1_ = local_48->index_[1], uVar2._6_1_ = local_48->index_[2],
              uVar2._7_1_ = local_48->index_[3], uVar2 <= sStack_28) {
          sStack_28 = sStack_28 - *(ulong *)local_48;
          node = (CordRepBtree *)((long)&(node->super_CordRep).length + 1);
          pCVar5 = (CordRepBtree *)CordRepBtree::end(pCVar4);
          if (node == pCVar5) {
            __assert_fail("index != node->end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                          ,100,
                          "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Skip(size_t)"
                         );
          }
          local_48 = (CordRepBtreeNavigator *)CordRepBtree::Edge(pCVar4,(size_t)node);
        }
      }
      this->index_[0] = (uint8_t)node;
      this_local = local_48;
      local_10 = sStack_28;
LAB_00695f61:
      PVar3.offset = local_10;
      PVar3.edge = (CordRep *)this_local;
      return PVar3;
    }
    sStack_28 = sStack_28 - *(ulong *)local_48;
    while( true ) {
      node = (CordRepBtree *)((long)&(node->super_CordRep).length + 1);
      pCVar4 = (CordRepBtree *)CordRepBtree::end((CordRepBtree *)edge);
      if (node != pCVar4) break;
      index._4_4_ = index._4_4_ + 1;
      if (this->height_ < index._4_4_) {
        this_local = (CordRepBtreeNavigator *)0x0;
        local_10 = sStack_28;
        goto LAB_00695f61;
      }
      edge = &this->node_[index._4_4_]->super_CordRep;
      node = (CordRepBtree *)(ulong)this->index_[index._4_4_];
    }
    local_48 = (CordRepBtreeNavigator *)CordRepBtree::Edge((CordRepBtree *)edge,(size_t)node);
  } while( true );
}

Assistant:

CordRepBtreeNavigator::Position CordRepBtreeNavigator::Skip(size_t n) {
  int height = 0;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);

  // Overall logic: Find an edge of at least the length we need to skip.
  // We consume all edges which are smaller (i.e., must be 100% skipped).
  // If we exhausted all edges on the current level, we move one level
  // up the tree, and repeat until we either find the edge, or until we hit
  // the top of the tree meaning the skip exceeds tree->length.
  while (n >= edge->length) {
    n -= edge->length;
    while (++index == node->end()) {
      if (++height > height_) return {nullptr, n};
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
  }

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be skipped.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);
    while (n >= edge->length) {
      n -= edge->length;
      ++index;
      assert(index != node->end());
      edge = node->Edge(index);
    }
  }
  index_[0] = static_cast<uint8_t>(index);
  return {edge, n};
}